

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3CompareAffinity(Expr *pExpr,char aff2)

{
  byte in_SIL;
  char aff1;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffee;
  byte local_1;
  
  local_1 = sqlite3ExprAffinity((Expr *)CONCAT17(in_SIL,CONCAT16(in_stack_ffffffffffffffee,
                                                                 CONCAT24(in_stack_ffffffffffffffec,
                                                                          in_stack_ffffffffffffffe8)
                                                                )));
  if (((char)local_1 < 'A') || ((char)in_SIL < 'A')) {
    if ((char)local_1 < 'A') {
      local_1 = in_SIL;
    }
    local_1 = local_1 | 0x40;
  }
  else if (((char)local_1 < 'C') && ((char)in_SIL < 'C')) {
    local_1 = 0x41;
  }
  else {
    local_1 = 0x43;
  }
  return local_1;
}

Assistant:

SQLITE_PRIVATE char sqlite3CompareAffinity(const Expr *pExpr, char aff2){
  char aff1 = sqlite3ExprAffinity(pExpr);
  if( aff1>SQLITE_AFF_NONE && aff2>SQLITE_AFF_NONE ){
    /* Both sides of the comparison are columns. If one has numeric
    ** affinity, use that. Otherwise use no affinity.
    */
    if( sqlite3IsNumericAffinity(aff1) || sqlite3IsNumericAffinity(aff2) ){
      return SQLITE_AFF_NUMERIC;
    }else{
      return SQLITE_AFF_BLOB;
    }
  }else{
    /* One side is a column, the other is not. Use the columns affinity. */
    assert( aff1<=SQLITE_AFF_NONE || aff2<=SQLITE_AFF_NONE );
    return (aff1<=SQLITE_AFF_NONE ? aff2 : aff1) | SQLITE_AFF_NONE;
  }
}